

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::emitGlobalType(PrintSExpression *this,Global *curr)

{
  ostream *poVar1;
  
  if (curr->mutable_ == true) {
    std::operator<<(this->o,"(mut ");
    poVar1 = printType(this,(Type)(curr->type).id);
    std::operator<<(poVar1,')');
    return;
  }
  printType(this,(Type)(curr->type).id);
  return;
}

Assistant:

void PrintSExpression::emitGlobalType(Global* curr) {
  if (curr->mutable_) {
    o << "(mut ";
    printType(curr->type) << ')';
  } else {
    printType(curr->type);
  }
}